

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimulationDecPOMDPDiscrete.cpp
# Opt level: O0

SimulationResult * __thiscall
SimulationDecPOMDPDiscrete::RunSimulations(SimulationDecPOMDPDiscrete *this,JointPolicyDiscrete *jp)

{
  undefined1 uVar1;
  int iVar2;
  void *this_00;
  undefined8 in_RDX;
  Simulation *in_RSI;
  SimulationResult *in_RDI;
  double in_XMM0_Qa;
  double res;
  int i;
  SimulationResult *result;
  ostream *in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffffd4;
  int in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar3;
  int iVar4;
  uint3 in_stack_ffffffffffffffe4;
  uint uVar5;
  
  uVar5 = (uint)in_stack_ffffffffffffffe4;
  Simulation::GetRandomSeed(in_RSI);
  Simulation::GetNrRuns(in_RSI);
  SimulationResult::SimulationResult
            ((SimulationResult *)CONCAT44(uVar5,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffdc
             ,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4);
  iVar3 = 0;
  while (iVar4 = iVar3, iVar2 = Simulation::GetNrRuns(in_RSI), iVar3 < iVar2) {
    (*in_RSI->_vptr_Simulation[2])(in_RSI,in_RDX);
    uVar1 = Simulation::GetVerbose(in_RSI);
    if ((bool)uVar1) {
      in_stack_ffffffffffffff88 = std::operator<<((ostream *)&std::cout,"Run ended r=");
      this_00 = (void *)std::ostream::operator<<(in_stack_ffffffffffffff88,in_XMM0_Qa);
      std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    }
    SimulationResult::AddReward
              ((SimulationResult *)CONCAT17(uVar1,in_stack_ffffffffffffff90),
               (double)in_stack_ffffffffffffff88);
    iVar3 = iVar4 + 1;
  }
  return in_RDI;
}

Assistant:

SimulationResult
SimulationDecPOMDPDiscrete::RunSimulations(const JointPolicyDiscrete *jp) const
{
    SimulationResult result(_m_horizon,GetRandomSeed(),GetNrRuns());
#if 0
    if(GetVerbose())
        jp->Print();
#endif
    // Run the simulations
    int i;
    for(i=0;i<GetNrRuns();i++)
    {
        double res = RunSimulation(jp);
        if(GetVerbose())
            cout << "Run ended r="<<res<<endl;
        result.AddReward(res);
    }

    return(result);
}